

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

void __thiscall
persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::
assemble_columns_to_reduce
          (persistence_computer_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
           *this,index_t dimension,pivot_column_index_t *pivot_column_index)

{
  iterator *piVar1;
  unsigned_long uVar2;
  _Elt_pointer piVar3;
  directed_flag_complex_computer_t *pdVar4;
  pair<float,_int> *ppVar5;
  ostream *poVar6;
  ulong uVar7;
  int *piVar8;
  filtered_directed_graph_t *pfVar9;
  vector<float,_std::allocator<float>_> *pvVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  pair<float,_int> local_38;
  
  uVar2 = (this->complex->cell_count).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[(long)dimension + 1];
  std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::clear
            (&this->columns_to_reduce);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"assembling ",0xb);
  uVar15 = (uint)uVar2;
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,uVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," columns",8);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\r",1);
  if (0 < (int)uVar15) {
    uVar14 = 0;
    do {
      piVar3 = (pivot_column_index->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      uVar7 = ((long)piVar3 -
               (long)(pivot_column_index->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 2) + uVar14;
      if ((long)uVar7 < 0) {
        uVar12 = (long)uVar7 >> 7;
LAB_0014123d:
        piVar8 = (pivot_column_index->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                 super__Deque_impl_data._M_start._M_node[uVar12] + uVar7 + uVar12 * -0x80;
      }
      else {
        if (0x7f < uVar7) {
          uVar12 = uVar7 >> 7;
          goto LAB_0014123d;
        }
        piVar8 = piVar3 + uVar14;
      }
      if (*piVar8 == 0x7fffffff) {
        pdVar4 = this->complex;
        if (pdVar4->filtration_algorithm == (filtration_algorithm_t *)0x0) {
          fVar16 = 0.0;
        }
        else {
          if (dimension == 0) {
            pfVar9 = pdVar4->graph;
            lVar11 = 0xc0;
LAB_00141289:
            pvVar10 = (vector<float,_std::allocator<float>_> *)
                      ((long)&(pfVar9->super_directed_graph_t).number_of_vertices + lVar11);
          }
          else {
            if (dimension == -1) {
              pfVar9 = pdVar4->graph;
              lVar11 = 0xa8;
              goto LAB_00141289;
            }
            pvVar10 = &pdVar4->next_filtration;
          }
          fVar16 = (pvVar10->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar14];
        }
        if (fVar16 <= this->max_filtration) {
          local_38 = (pair<float,_int>)((ulong)(uint)fVar16 | uVar14 << 0x20);
          ppVar5 = &((this->columns_to_reduce).
                     super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                     _M_impl.super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int>;
          if (ppVar5 == &(this->columns_to_reduce).
                         super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_last[-1].super_pair<float,_int>
             ) {
            std::deque<filtration_index_t,_std::allocator<filtration_index_t>_>::
            _M_push_back_aux<filtration_index_t>
                      (&this->columns_to_reduce,(filtration_index_t *)&local_38);
          }
          else {
            *ppVar5 = local_38;
            piVar1 = &(this->columns_to_reduce).
                      super__Deque_base<filtration_index_t,_std::allocator<filtration_index_t>_>.
                      _M_impl.super__Deque_impl_data._M_finish;
            piVar1->_M_cur = piVar1->_M_cur + 1;
          }
        }
        iVar13 = (int)uVar14 + 1;
        if (((uint)(iVar13 * 0xbcbe61d) >> 5 | iVar13 * -0x18000000) < 0xa7c6) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"assembled ",10);
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," out of ",8);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar15);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," columns",8);
          poVar6 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\r",1);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != (uVar15 & 0x7fffffff));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[K",3);
  return;
}

Assistant:

void assemble_columns_to_reduce(index_t dimension, pivot_column_index_t& pivot_column_index) {
		index_t num_cells = index_t(complex.number_of_cells(dimension + 1));

		columns_to_reduce.clear();

#ifdef INDICATE_PROGRESS
		std::cout << "\033[K"
		          << "assembling " << num_cells << " columns" << std::flush << "\r";
#endif

		for (index_t index = 0; index < num_cells; ++index) {
			if (
#ifdef USE_ARRAY_HASHMAP
			    pivot_column_index[index] == INVALID_INDEX
#else
			    pivot_column_index.find(index) == pivot_column_index.end()
#endif
			) {
				value_t filtration = complex.filtration(dimension + 1, index);
				if (filtration <= max_filtration) { columns_to_reduce.push_back(std::make_pair(filtration, index)); }
#ifdef INDICATE_PROGRESS
				if ((index + 1) % 100000 == 0)
					std::cout << "\033[K"
					          << "assembled " << columns_to_reduce.size() << " out of " << (index + 1) << "/"
					          << num_cells << " columns" << std::flush << "\r";
#endif
			}
		}
#ifdef INDICATE_PROGRESS
		std::cout << "\033[K";
#endif
	}